

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_merge(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap;
  jx9_hashmap *pjVar1;
  jx9_hashmap_node *pNode;
  sxi32 sVar2;
  jx9_value *pValue;
  jx9_value *pjVar3;
  jx9_hashmap_node **ppjVar4;
  uint uVar5;
  ulong uVar6;
  jx9_value sKey;
  jx9_value local_70;
  
  if (0 < nArg) {
    pValue = jx9_context_new_array(pCtx);
    if (pValue != (jx9_value *)0x0) {
      pMap = (jx9_hashmap *)(pValue->x).pOther;
      uVar6 = 0;
      do {
        if (uVar6 == (uint)nArg) {
          jx9_result_value(pCtx,pValue);
          return 0;
        }
        pjVar3 = apArg[uVar6];
        if ((pjVar3->iFlags & 0x40) == 0) {
          jx9_array_add_elem(pValue,(jx9_value *)0x0,pjVar3);
        }
        else {
          pjVar1 = (jx9_hashmap *)(pjVar3->x).iVal;
          if (pjVar1 != pMap) {
            ppjVar4 = &pjVar1->pFirst;
            for (uVar5 = 0; uVar5 < pjVar1->nEntry; uVar5 = uVar5 + 1) {
              pNode = *ppjVar4;
              pjVar3 = HashmapExtractNodeValue(pNode);
              if (pNode->iType == 2) {
                jx9MemObjInitFromString(pMap->pVm,&local_70,(SyString *)0x0);
                jx9MemObjStringAppend
                          (&local_70,(char *)(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte);
                sVar2 = HashmapInsert(pMap,&local_70,pjVar3);
                jx9MemObjRelease(&local_70);
              }
              else {
                sVar2 = HashmapInsert(pMap,(jx9_value *)0x0,pjVar3);
              }
              if (sVar2 != 0) break;
              ppjVar4 = &pNode->pPrev;
            }
          }
        }
        uVar6 = uVar6 + 1;
      } while( true );
    }
  }
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int jx9_hashmap_merge(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap, *pSrc;
	jx9_value *pArray;
	int i;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the hashmap */
	pMap = (jx9_hashmap *)pArray->x.pOther;
	/* Start merging */
	for( i = 0 ; i < nArg ; i++ ){
		/* Make sure we are dealing with a valid hashmap */
		if( !jx9_value_is_json_array(apArg[i]) ){
			/* Insert scalar value */
			jx9_array_add_elem(pArray, 0, apArg[i]);
		}else{
			pSrc = (jx9_hashmap *)apArg[i]->x.pOther;
			/* Merge the two hashmaps */
			HashmapMerge(pSrc, pMap);
		}
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}